

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 jx9MemObjAdd(jx9_value *pObj1,jx9_value *pObj2,int bAddStore)

{
  jx9_hashmap *pjVar1;
  jx9_hashmap_node *pNode;
  uint uVar2;
  sxi32 sVar3;
  int iVar4;
  uint uVar5;
  jx9_hashmap *pDest;
  jx9_value *pjVar6;
  undefined4 in_register_00000014;
  jx9_hashmap_node **ppjVar8;
  ulong uVar7;
  
  if (((pObj2->iFlags | pObj1->iFlags) & 0x40U) == 0) {
    jx9MemObjToNumeric(pObj1);
    jx9MemObjToNumeric(pObj2);
    uVar5 = pObj1->iFlags;
    uVar2 = pObj2->iFlags;
    if (((uVar2 | uVar5) & 4) != 0) {
      if ((uVar5 & 4) == 0) {
        jx9MemObjToReal(pObj1);
        uVar2 = pObj2->iFlags;
      }
      if ((uVar2 & 4) == 0) {
        jx9MemObjToReal(pObj2);
      }
      (pObj1->x).rVal = (pObj1->x).rVal + (pObj2->x).rVal;
      pObj1->iFlags = pObj1->iFlags & 0xfffffe90U | 4;
      sVar3 = MemObjTryIntger(pObj1);
      return sVar3;
    }
    uVar7 = (pObj2->x).iVal;
    (pObj1->x).pOther = (void *)((long)(pObj1->x).pOther + uVar7);
    pObj1->iFlags = uVar5 & 0xfffffe90 | 2;
  }
  else {
    if (bAddStore == 0) {
      pDest = jx9NewHashmap(pObj1->pVm,(_func_sxu32_sxi64 *)pObj2,
                            (_func_sxu32_void_ptr_sxu32 *)CONCAT44(in_register_00000014,bAddStore));
      if (pDest == (jx9_hashmap *)0x0) {
LAB_0011d2e1:
        sVar3 = jx9VmThrowError(pObj1->pVm,(SyString *)0x0,1,
                                "JX9 is running out of memory while creating array");
        return sVar3;
      }
      if ((pObj1->iFlags & 0x40U) == 0) {
        if ((pObj1->iFlags & 0x20U) == 0) {
          HashmapInsert(pDest,(jx9_value *)0x0,pObj1);
        }
      }
      else {
        jx9HashmapDup((jx9_hashmap *)(pObj1->x).pOther,pDest);
      }
    }
    else {
      if ((pObj1->iFlags & 0x40U) == 0) {
        sVar3 = jx9MemObjToHashmap(pObj1);
        if (sVar3 != 0) goto LAB_0011d2e1;
      }
      pDest = (jx9_hashmap *)(pObj1->x).pOther;
    }
    if ((pObj2->iFlags & 0x40U) == 0) {
      if ((pObj2->iFlags & 0x20U) == 0) {
        HashmapInsert(pDest,(jx9_value *)0x0,pObj2);
      }
    }
    else {
      pjVar1 = (jx9_hashmap *)(pObj2->x).iVal;
      if (pDest != pjVar1) {
        ppjVar8 = &pjVar1->pFirst;
        for (uVar5 = 0; uVar5 < pjVar1->nEntry; uVar5 = uVar5 + 1) {
          pNode = *ppjVar8;
          if (pNode->iType == 2) {
            sVar3 = HashmapLookupBlobKey
                              (pDest,(pNode->xKey).sKey.pBlob,(pNode->xKey).sKey.nByte,
                               (jx9_hashmap_node **)0x0);
            if (sVar3 != 0) {
              pjVar6 = HashmapExtractNodeValue(pNode);
              if (pjVar6 != (jx9_value *)0x0) {
                iVar4 = HashmapInsertBlobKey
                                  (pDest,(pNode->xKey).sKey.pBlob,(pNode->xKey).sKey.nByte,pjVar6);
LAB_0011d3bb:
                if (iVar4 != 0) break;
              }
            }
          }
          else {
            sVar3 = HashmapLookupIntKey(pDest,(pNode->xKey).iKey,(jx9_hashmap_node **)0x0);
            if (sVar3 != 0) {
              pjVar6 = HashmapExtractNodeValue(pNode);
              if (pjVar6 != (jx9_value *)0x0) {
                iVar4 = HashmapInsertIntKey(pDest,(pNode->xKey).iKey,pjVar6);
                goto LAB_0011d3bb;
              }
            }
          }
          ppjVar8 = &pNode->pPrev;
        }
      }
    }
    uVar5 = pObj1->iFlags;
    if ((uVar5 & 1) != 0) {
      SyBlobRelease(&pObj1->sBlob);
      uVar5 = pObj1->iFlags;
    }
    (pObj1->x).pOther = pDest;
    uVar5 = uVar5 & 0xfffffe90 | 0x40;
    uVar7 = (ulong)uVar5;
    pObj1->iFlags = uVar5;
  }
  return (sxi32)uVar7;
}

Assistant:

JX9_PRIVATE sxi32 jx9MemObjAdd(jx9_value *pObj1, jx9_value *pObj2, int bAddStore)
{
	if( ((pObj1->iFlags|pObj2->iFlags) & MEMOBJ_HASHMAP) == 0 ){
			/* Arithemtic operation */
			jx9MemObjToNumeric(pObj1);
			jx9MemObjToNumeric(pObj2);
			if( (pObj1->iFlags|pObj2->iFlags) & MEMOBJ_REAL ){
				/* Floating point arithmetic */
				jx9_real a, b;
				if( (pObj1->iFlags & MEMOBJ_REAL) == 0 ){
					jx9MemObjToReal(pObj1);
				}
				if( (pObj2->iFlags & MEMOBJ_REAL) == 0 ){
					jx9MemObjToReal(pObj2);
				}
				a = pObj1->x.rVal;
				b = pObj2->x.rVal;
				pObj1->x.rVal = a+b;
				MemObjSetType(pObj1, MEMOBJ_REAL);
				/* Try to get an integer representation also */
				MemObjTryIntger(&(*pObj1));
			}else{
				/* Integer arithmetic */
				sxi64 a, b;
				a = pObj1->x.iVal;
				b = pObj2->x.iVal;
				pObj1->x.iVal = a+b;
				MemObjSetType(pObj1, MEMOBJ_INT);
			}
	}else{
		if( (pObj1->iFlags|pObj2->iFlags) & MEMOBJ_HASHMAP ){
			jx9_hashmap *pMap;
			sxi32 rc;
			if( bAddStore ){
				/* Do not duplicate the hashmap, use the left one since its an add&store operation.
				 */
				if( (pObj1->iFlags & MEMOBJ_HASHMAP) == 0 ){				
					/* Force a hashmap cast */
					rc = jx9MemObjToHashmap(pObj1);
					if( rc != SXRET_OK ){
						jx9VmThrowError(pObj1->pVm, 0, JX9_CTX_ERR, "JX9 is running out of memory while creating array");
						return rc;
					}
				}
				/* Point to the structure that describe the hashmap */
				pMap = (jx9_hashmap *)pObj1->x.pOther;
			}else{
				/* Create a new hashmap */
				pMap = jx9NewHashmap(pObj1->pVm, 0, 0);
				if( pMap == 0){
					jx9VmThrowError(pObj1->pVm, 0, JX9_CTX_ERR, "JX9 is running out of memory while creating array");
					return SXERR_MEM;
				}
			}
			if( !bAddStore ){
				if(pObj1->iFlags & MEMOBJ_HASHMAP ){
					/* Perform a hashmap duplication */
					jx9HashmapDup((jx9_hashmap *)pObj1->x.pOther, pMap);
				}else{
					if((pObj1->iFlags & MEMOBJ_NULL) == 0 ){
						/* Simple insertion */
						jx9HashmapInsert(pMap, 0, pObj1);
					}
				}
			}
			/* Perform the union */
			if(pObj2->iFlags & MEMOBJ_HASHMAP ){
				jx9HashmapUnion(pMap, (jx9_hashmap *)pObj2->x.pOther);
			}else{
				if((pObj2->iFlags & MEMOBJ_NULL) == 0 ){
					/* Simple insertion */
					jx9HashmapInsert(pMap, 0, pObj2);
				}
			}
			/* Reflect the change */
			if( pObj1->iFlags & MEMOBJ_STRING ){
				SyBlobRelease(&pObj1->sBlob);
			}
			pObj1->x.pOther = pMap;
			MemObjSetType(pObj1, MEMOBJ_HASHMAP);
		}
	}
	return SXRET_OK;
}